

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Import * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Import,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,LiteralString **args_2)

{
  Import *lr;
  Fodder *in_RDI;
  Import *r;
  LiteralString *in_stack_ffffffffffffffa8;
  Import *in_stack_ffffffffffffffc0;
  
  lr = (Import *)operator_new(0x88);
  Import::Import(in_stack_ffffffffffffffc0,(LocationRange *)lr,in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)lr,
             (value_type *)lr);
  return lr;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }